

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O3

void __thiscall QAction::setStatusTip(QAction *this,QString *statustip)

{
  QActionPrivate *this_00;
  long lVar1;
  char cVar2;
  QStringView QVar3;
  QStringView QVar4;
  
  this_00 = *(QActionPrivate **)&this->field_0x8;
  lVar1 = (this_00->statustip).d.size;
  if (lVar1 == (statustip->d).size) {
    QVar3.m_data = (this_00->statustip).d.ptr;
    QVar3.m_size = lVar1;
    QVar4.m_data = (statustip->d).ptr;
    QVar4.m_size = lVar1;
    cVar2 = QtPrivate::equalStrings(QVar3,QVar4);
    if (cVar2 != '\0') {
      return;
    }
  }
  QString::operator=(&this_00->statustip,(QString *)statustip);
  QActionPrivate::sendDataChanged(this_00);
  return;
}

Assistant:

void QAction::setStatusTip(const QString &statustip)
{
    Q_D(QAction);
    if (d->statustip == statustip)
        return;

    d->statustip = statustip;
    d->sendDataChanged();
}